

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

int If_CutMergeOrdered(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1,If_Cut_t *pC)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar1 = *(uint *)&pC0->field_0x1c;
  uVar8 = uVar1 >> 0x18;
  uVar6 = *(uint *)&pC1->field_0x1c;
  uVar9 = uVar6 >> 0x18;
  uVar11 = uVar1 >> 0x10 & 0xff;
  if ((uVar8 == uVar11) && (uVar9 == uVar11)) {
    if (0xffffff < uVar1) {
      uVar10 = 0;
      do {
        if ((&pC0[1].Area)[uVar10] != (&pC1[1].Area)[uVar10]) {
          return 0;
        }
        (&pC[1].Area)[uVar10] = (&pC0[1].Area)[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    uVar6 = uVar6 & 0xff000000;
  }
  else {
    uVar12 = 0;
    iVar4 = 0;
    if (uVar1 < 0x1000000) {
LAB_008baf75:
      if ((int)(uVar11 + uVar12) < (int)(iVar4 + uVar9)) {
        return 0;
      }
      if ((int)uVar12 < (int)uVar9) {
        lVar7 = 0;
        do {
          (&pC[1].Area)[iVar4 + lVar7] = (&pC1[1].Area)[(int)uVar12 + lVar7];
          lVar7 = lVar7 + 1;
        } while ((ulong)uVar9 - (long)(int)uVar12 != lVar7);
        iVar4 = iVar4 + (int)lVar7;
      }
      uVar6 = iVar4 << 0x18;
    }
    else {
      uVar5 = 0;
      iVar4 = 0;
      if (0xffffff < uVar6) {
        if (uVar11 != 0) {
          lVar7 = 0;
          uVar6 = 0;
          uVar5 = 0;
          do {
            fVar2 = (&pC0[1].Area)[(int)uVar5];
            fVar3 = (&pC1[1].Area)[(int)uVar6];
            if ((int)fVar2 < (int)fVar3) {
              uVar5 = uVar5 + 1;
              (&pC[1].Area)[lVar7] = fVar2;
              uVar12 = uVar6;
              if (uVar5 == uVar8) {
LAB_008bb09c:
                iVar4 = (int)lVar7 + 1;
                goto LAB_008baf75;
              }
            }
            else {
              if ((int)fVar3 < (int)fVar2) {
                (&pC[1].Area)[lVar7] = fVar3;
              }
              else {
                uVar5 = uVar5 + 1;
                (&pC[1].Area)[lVar7] = fVar2;
                uVar12 = uVar6 + 1;
                if (uVar5 == uVar8) goto LAB_008bb09c;
              }
              uVar6 = uVar6 + 1;
              if (uVar6 == uVar9) {
                iVar4 = (int)lVar7 + 1;
                goto LAB_008bafd7;
              }
            }
            lVar7 = lVar7 + 1;
          } while ((uVar1 >> 0x10 & 0xff) != (uint)lVar7);
        }
        return 0;
      }
LAB_008bafd7:
      if ((int)(uVar11 + uVar5) < (int)(iVar4 + uVar8)) {
        return 0;
      }
      if ((int)uVar5 < (int)uVar8) {
        lVar7 = 0;
        do {
          (&pC[1].Area)[iVar4 + lVar7] = (&pC0[1].Area)[(int)uVar5 + lVar7];
          lVar7 = lVar7 + 1;
        } while ((ulong)uVar8 - (long)(int)uVar5 != lVar7);
        iVar4 = iVar4 + (int)lVar7;
      }
      uVar6 = iVar4 << 0x18;
    }
  }
  *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffff | uVar6;
  pC->uSign = pC1->uSign | pC0->uSign;
  return 1;
}

Assistant:

int If_CutMergeOrdered( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1, If_Cut_t * pC )
{ 
    int nSizeC0 = pC0->nLeaves;
    int nSizeC1 = pC1->nLeaves;
    int nLimit  = pC0->nLimit;
    int i, k, c, s;

    // both cuts are the largest
    if ( nSizeC0 == nLimit && nSizeC1 == nLimit )
    {
        for ( i = 0; i < nSizeC0; i++ )
        {
            if ( pC0->pLeaves[i] != pC1->pLeaves[i] )
                return 0;
            pC->pLeaves[i] = pC0->pLeaves[i];
        }
        pC->nLeaves = nLimit;
        pC->uSign = pC0->uSign | pC1->uSign;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = c = s = 0; 
    if ( nSizeC0 == 0 ) goto FlushCut1;
    if ( nSizeC1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLimit ) return 0;
        if ( pC0->pLeaves[i] < pC1->pLeaves[k] )
        {
            pC->pLeaves[c++] = pC0->pLeaves[i++];
            if ( i == nSizeC0 ) goto FlushCut1;
        }
        else if ( pC0->pLeaves[i] > pC1->pLeaves[k] )
        {
            pC->pLeaves[c++] = pC1->pLeaves[k++];
            if ( k == nSizeC1 ) goto FlushCut0;
        }
        else
        {
            pC->pLeaves[c++] = pC0->pLeaves[i++]; k++;
            if ( i == nSizeC0 ) goto FlushCut1;
            if ( k == nSizeC1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSizeC0 > nLimit + i ) return 0;
    while ( i < nSizeC0 )
        pC->pLeaves[c++] = pC0->pLeaves[i++];
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    return 1;

FlushCut1:
    if ( c + nSizeC1 > nLimit + k ) return 0;
    while ( k < nSizeC1 )
        pC->pLeaves[c++] = pC1->pLeaves[k++];
    pC->nLeaves = c;
    pC->uSign = pC0->uSign | pC1->uSign;
    return 1;
}